

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSphere>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomSphere *sphere
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr __k;
  _Base_ptr p_Var2;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  int iVar10;
  string *name;
  _Rb_tree_header *p_Var11;
  bool bVar12;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_288;
  undefined1 local_268 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_240;
  _Base_ptr local_238;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_230;
  Property *local_228;
  _Base_ptr local_220;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar12 = false;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&local_1d8,properties,&sphere->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar3) {
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar12 = true;
    if ((_Rb_tree_header *)p_Var8 != p_Var11) {
      local_230 = &sphere->radius;
      local_240 = &(sphere->super_GPrim).props;
      local_238 = &p_Var11->_M_header;
      do {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        name = local_1a8;
        local_220 = p_Var8;
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)name,"radius","");
        local_228 = (Property *)(p_Var8 + 2);
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_268,&local_1d8,&local_1f8,(Property *)(p_Var8 + 2),name,
                   local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        p_Var2 = local_238;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = local_220;
        iVar10 = 0;
        if ((local_268._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00210c8b:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (local_268._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0xd69);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            local_218[0] = local_208;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_218,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      (&local_288,(fmt *)local_218,(string *)0x3de6c0,(char (*) [7])(local_268 + 8),
                       name);
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_288._M_dataplus._M_p,
                                local_288._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_218[0] != local_208) {
              operator_delete(local_218[0],local_208[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar5 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_218,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_288.field_2._M_allocated_capacity = *psVar1;
                local_288.field_2._8_8_ = plVar5[3];
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              }
              else {
                local_288.field_2._M_allocated_capacity = *psVar1;
                local_288._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_288._M_string_length = plVar5[1];
              *plVar5 = (long)psVar1;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_288);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                local_288.field_2._M_allocated_capacity + 1);
              }
              if (local_218[0] != local_208) {
                operator_delete(local_218[0],local_208[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar10 = 1;
            goto LAB_00210c8b;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._8_8_ != &aStack_250) {
          operator_delete((void *)local_268._8_8_,aStack_250._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          if ((iVar10 == 3) || (iVar10 == 0)) goto LAB_00210e27;
LAB_00211009:
          bVar12 = false;
          goto LAB_0021100c;
        }
        __k = p_Var8 + 1;
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1d8,(key_type *)__k);
        if ((_Rb_tree_header *)cVar6._M_node == &local_1d8._M_t._M_impl.super__Rb_tree_header) {
          pmVar7 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](local_240,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar7);
          (pmVar7->_attrib)._varying_authored = (bool)p_Var8[3].field_0x4;
          (pmVar7->_attrib)._variability = p_Var8[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar7->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar7->_attrib)._var,(any *)&p_Var8[4]._M_parent);
          (pmVar7->_attrib)._var._blocked = SUB41(p_Var8[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar7->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var8[5]._M_parent);
          (pmVar7->_attrib)._var._ts._dirty = SUB41(p_Var8[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar7->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var8[6]._M_parent
                    );
          AttrMetas::operator=(&(pmVar7->_attrib)._metas,(AttrMetas *)(p_Var8 + 7));
          *(_Base_ptr *)&pmVar7->_listOpQual = p_Var8[0x17]._M_parent;
          (pmVar7->_rel).type = *(Type *)&p_Var8[0x17]._M_left;
          Path::operator=(&(pmVar7->_rel).targetPath,(Path *)&p_Var8[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar7->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var8[0x1e]._M_parent);
          (pmVar7->_rel).listOpQual = p_Var8[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar7->_rel)._metas,(AttrMetas *)&p_Var8[0x1f]._M_parent);
          (pmVar7->_rel)._varying_authored = *(bool *)&p_Var8[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar7->_prop_value_type_name);
          pmVar7->_has_custom = *(bool *)&p_Var8[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1d8,(key_type *)__k);
        if ((_Rb_tree_header *)cVar6._M_node == &local_1d8._M_t._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0xd6b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_268._0_8_,local_268._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          psVar1 = (size_type *)(local_268 + 0x10);
          if ((size_type *)local_268._0_8_ != psVar1) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_288,(ulong)(err->_M_dataplus)._M_p);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              local_268._16_8_ = *psVar9;
              aStack_250._M_allocated_capacity = plVar5[3];
              local_268._0_8_ = psVar1;
            }
            else {
              local_268._16_8_ = *psVar9;
              local_268._0_8_ = (size_type *)*plVar5;
            }
            local_268._8_8_ = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_268);
            if ((size_type *)local_268._0_8_ != psVar1) {
              operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          goto LAB_00211009;
        }
LAB_00210e27:
        p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      } while (p_Var8 != p_Var2);
      bVar12 = true;
    }
  }
LAB_0021100c:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1d8,
             (_Link_type)local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar12;
}

Assistant:

bool ReconstructPrim<GeomSphere>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomSphere *sphere,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct Sphere.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, sphere, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "radius", GeomSphere, sphere->radius)
    ADD_PROPERTY(table, prop, GeomSphere, sphere->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}